

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mldsa_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_37bab4::MLDSATest_Basic65_Test::~MLDSATest_Basic65_Test
          (MLDSATest_Basic65_Test *this)

{
  MLDSATest_Basic65_Test *this_local;
  
  ~MLDSATest_Basic65_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MLDSATest, Basic65) {
  MLDSABasicTest<MLDSA65_private_key, MLDSA65_public_key,
                 MLDSA65_PUBLIC_KEY_BYTES, MLDSA65_SIGNATURE_BYTES,
                 MLDSA65_generate_key, MLDSA65_sign, MLDSA65_parse_public_key,
                 MLDSA65_verify, MLDSA65_private_key_from_seed,
                 BCM_mldsa65_private_key, BCM_mldsa65_parse_private_key,
                 BCM_mldsa65_marshal_private_key>();
}